

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> __thiscall
anurbs::
new_<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>const&,anurbs::Interval_const&>
          (anurbs *this,Ref<anurbs::NurbsCurveGeometry<3L>_> *args,Interval *args_1)

{
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this_00;
  Ref<anurbs::NurbsCurveGeometry<3L>_> local_30;
  Interval *local_20;
  Interval *args_local_1;
  Ref<anurbs::NurbsCurveGeometry<3L>_> *args_local;
  
  local_20 = args_1;
  args_local_1 = (Interval *)args;
  args_local = (Ref<anurbs::NurbsCurveGeometry<3L>_> *)this;
  this_00 = (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *)operator_new(0x28);
  Ref<anurbs::NurbsCurveGeometry<3L>_>::Ref
            (&local_30,(Ref<anurbs::NurbsCurveGeometry<3L>_> *)args_local_1);
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::Curve(this_00,&local_30,*local_20);
  std::
  unique_ptr<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>,std::default_delete<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>>
  ::
  unique_ptr<std::default_delete<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>,void>
            ((unique_ptr<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>,std::default_delete<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>>
              *)this,this_00);
  Ref<anurbs::NurbsCurveGeometry<3L>_>::~Ref(&local_30);
  return (__uniq_ptr_data<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_std::default_delete<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_std::default_delete<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}